

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell_xml.cpp
# Opt level: O2

void __thiscall UnitcellXMLTest_ReadXML1_Test::TestBody(UnitcellXMLTest_ReadXML1_Test *this)

{
  bool bVar1;
  self_type *pt_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_230;
  AssertionResult gtest_ar_;
  offset_t offset;
  AssertHelper local_1f8;
  unitcell cell;
  ptree pt;
  istringstream is;
  
  std::__cxx11::string::string
            ((string *)&cell,
             "\n<UNITCELL name=\"simple1d\" dimension=\"1\">\n  <VERTEX/>\n  <EDGE><SOURCE vertex=\"1\"/><TARGET vertex=\"1\" offset=\"1\"/></EDGE>\n</UNITCELL>\n    "
             ,(allocator *)&pt);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&cell,_S_in);
  std::__cxx11::string::~string((string *)&cell);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree(&pt);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cell,"LATTICES",0x2e);
  pcVar2 = "";
  pt_00 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::put<char[1]>(&pt,(path_type *)&cell,(char (*) [1])0x13dc34);
  std::__cxx11::string::~string((string *)&cell);
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((basic_istream<char,_std::char_traits<char>_> *)&is,pt_00,0);
  cell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&offset,"simple1d",(allocator *)&local_230);
  bVar1 = lattice::read_xml(&pt,(string *)&offset,&cell);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&offset);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&offset,(internal *)&gtest_ar_,
               (AssertionResult *)"read_xml(pt, \"simple1d\", cell)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x33,(char *)CONCAT71(offset.
                                      super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                                      m_storage.m_data._1_7_,
                                      (char)offset.
                                            super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data));
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&offset);
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_230.data_._0_4_ = 1;
  gtest_ar_._0_8_ = cell.dim_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&offset,"1","cell.dimension()",(int *)&local_230,
             (unsigned_long *)&gtest_ar_);
  if ((char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      pcVar2 = *(char **)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  local_230.data_._0_4_ = 1;
  gtest_ar_._0_8_ =
       ((long)cell.sites_.
              super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)cell.sites_.
             super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&offset,"1","cell.num_sites()",(int *)&local_230,
             (unsigned_long *)&gtest_ar_);
  if ((char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  local_230.data_._0_4_ = 1;
  gtest_ar_._0_8_ =
       ((long)cell.bonds_.
              super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)cell.bonds_.
             super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&offset,"1","cell.num_bonds()",(int *)&local_230,
             (unsigned_long *)&gtest_ar_);
  if ((char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&offset,"0","cell.bond(0).source",(int *)&gtest_ar_,
             &(cell.bonds_.
               super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
               ._M_impl.super__Vector_impl_data._M_start)->source);
  if ((char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&offset,"0","cell.bond(0).target",(int *)&gtest_ar_,
             &(cell.bonds_.
               super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
               ._M_impl.super__Vector_impl_data._M_start)->target);
  if ((char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  gtest_ar_._0_4_ = 1;
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix<int>(&offset,(int *)&gtest_ar_);
  *(undefined8 *)
   CONCAT71(offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data.
            _1_7_,(char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data) = 1;
  testing::internal::CmpHelperEQ<Eigen::Matrix<long,_1,1,0,_1,1>,Eigen::Matrix<long,_1,1,0,_1,1>>
            ((internal *)&gtest_ar_,"offset","cell.bond(0).target_offset",&offset,
             &(cell.bonds_.
               super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
               ._M_impl.super__Vector_impl_data._M_start)->target_offset);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/test/unitcell_xml.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  free((void *)CONCAT71(offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._1_7_,
                        (char)offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data));
  lattice::unitcell::~unitcell(&cell);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&pt);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return;
}

Assistant:

TEST(UnitcellXMLTest, ReadXML1) {
  std::istringstream is(R"(
<UNITCELL name="simple1d" dimension="1">
  <VERTEX/>
  <EDGE><SOURCE vertex="1"/><TARGET vertex="1" offset="1"/></EDGE>
</UNITCELL>
    )");

  ptree pt;
  ptree& root = pt.put("LATTICES", "");
  read_xml(is, root);

  unitcell cell;
  EXPECT_TRUE(read_xml(pt, "simple1d", cell));
  EXPECT_EQ(1, cell.dimension());
  EXPECT_EQ(1, cell.num_sites());
  EXPECT_EQ(1, cell.num_bonds());
  EXPECT_EQ(0, cell.bond(0).source);
  EXPECT_EQ(0, cell.bond(0).target);
  offset_t offset(1);
  offset << 1.0;
  EXPECT_EQ(offset, cell.bond(0).target_offset);
}